

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O1

RK_S32 mpp_av1_tile_info(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  RK_U8 RVar1;
  uint uVar2;
  byte bVar3;
  RK_S32 RVar4;
  RK_S32 RVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  byte bVar12;
  RK_S32 k;
  RK_U32 RVar13;
  int iVar14;
  AV1RawFrameHeader *pAVar15;
  uint uVar16;
  RK_U32 RVar17;
  int iVar18;
  RK_U32 range_max;
  int iVar19;
  RK_U32 RVar20;
  bool bVar21;
  RK_U32 value;
  RK_U16 local_68 [2];
  RK_S32 local_64;
  AV1RawFrameHeader *local_60;
  BitReadCtx_t *local_58;
  ulong local_50;
  ulong local_48;
  int local_3c;
  AV1Context *local_38;
  
  uVar16 = ctx->frame_width + 7 >> 2 & 0xfffffffe;
  uVar11 = ctx->frame_height + 7 >> 2 & 0xfffffffe;
  RVar1 = ctx->sequence_header->use_128x128_superblock;
  uVar8 = (int)(uVar16 + 0xf) >> 4;
  if (RVar1 != '\0') {
    uVar8 = (int)(uVar16 + 0x1f) >> 5;
  }
  local_48 = (ulong)uVar8;
  bVar3 = RVar1 == '\0' ^ 7;
  uVar16 = 0x1000 >> bVar3;
  RVar13 = 0xffffffff;
  do {
    RVar13 = RVar13 + 1;
  } while ((int)(uVar16 << ((byte)RVar13 & 0x1f)) < (int)uVar8);
  uVar2 = (int)(uVar11 + 0x1f) >> 5;
  if (RVar1 == '\0') {
    uVar2 = (int)(uVar11 + 0xf) >> 4;
  }
  local_50 = (ulong)uVar2;
  uVar11 = 0x40;
  if ((int)uVar8 < 0x40) {
    uVar11 = uVar8;
  }
  RVar20 = 0xffffffff;
  do {
    RVar20 = RVar20 + 1;
  } while (1 << ((byte)RVar20 & 0x1f) < (int)uVar11);
  uVar11 = 0x40;
  if ((int)uVar2 < 0x40) {
    uVar11 = uVar2;
  }
  range_max = 0xffffffff;
  do {
    range_max = range_max + 1;
  } while (1 << ((byte)range_max & 0x1f) < (int)uVar11);
  uVar11 = 0x900000 >> bVar3 * '\x02';
  iVar18 = uVar2 * uVar8;
  uVar8 = 0xffffffff;
  do {
    uVar8 = uVar8 + 1;
  } while ((int)(uVar11 << ((byte)uVar8 & 0x1f)) < iVar18);
  RVar17 = RVar13;
  if (RVar13 <= uVar8) {
    RVar17 = 0xffffffff;
    do {
      RVar17 = RVar17 + 1;
    } while ((int)(uVar11 << ((byte)RVar17 & 0x1f)) < iVar18);
  }
  local_60 = current;
  local_58 = gb;
  local_38 = ctx;
  local_64 = mpp_av1_read_unsigned(gb,1,"uniform_tile_spacing_flag",(RK_U32 *)local_68,0,1);
  if (local_64 < 0) {
    return local_64;
  }
  local_60->uniform_tile_spacing_flag = (RK_U8)local_68[0];
  if ((RK_U8)local_68[0] == '\0') {
    bVar3 = 0;
    if ((int)local_48 < 1) {
      uVar10 = 0;
      iVar14 = 0;
    }
    else {
      iVar19 = 0;
      uVar7 = 0;
      iVar14 = 0;
      do {
        local_3c = iVar14;
        RVar13 = (int)local_48 - iVar19;
        if ((int)uVar16 <= (int)RVar13) {
          RVar13 = uVar16;
        }
        RVar5 = mpp_av1_read_ns(local_58,"width_in_sbs_minus_1[i]",RVar13,(RK_U32 *)local_68);
        if (RVar5 < 0) goto LAB_001c5bcf;
        local_60->width_in_sbs_minus_1[uVar7] = (RK_U8)local_68[0];
        iVar9 = local_60->width_in_sbs_minus_1[uVar7] + 1;
        iVar14 = local_3c;
        if (local_3c < iVar9) {
          iVar14 = iVar9;
        }
        iVar19 = iVar19 + (uint)local_60->width_in_sbs_minus_1[uVar7] + 1;
        uVar10 = uVar7 + 1;
      } while ((iVar19 < (int)local_48) && (bVar21 = uVar7 < 0x3f, uVar7 = uVar10, bVar21));
    }
    do {
      bVar12 = bVar3;
      bVar3 = bVar12 + 1;
    } while (1 << (bVar12 & 0x1f) < (int)uVar10);
    bVar3 = (char)RVar17 + 1;
    if (RVar17 == 0) {
      bVar3 = 0;
    }
    local_60->tile_cols_log2 = bVar12;
    local_60->tile_cols = (RK_U16)uVar10;
    RVar13 = (iVar18 >> (bVar3 & 0x1f)) / iVar14;
    if ((int)RVar13 < 2) {
      RVar13 = 1;
    }
    bVar12 = 0;
    if (0 < (int)local_50) {
      iVar18 = 0 >> (bVar3 & 0x1f);
      uVar10 = 0;
LAB_001c5b66:
      RVar20 = (int)local_50 - iVar18;
      if ((int)RVar13 <= (int)RVar20) {
        RVar20 = RVar13;
      }
      RVar5 = mpp_av1_read_ns(local_58,"height_in_sbs_minus_1[i]",RVar20,(RK_U32 *)local_68);
      if (-1 < RVar5) goto code_r0x001c5b86;
      local_64 = -1;
      RVar5 = local_64;
LAB_001c5bcf:
      local_64 = RVar5;
      bVar21 = false;
      goto LAB_001c5c65;
    }
    uVar7 = 0;
LAB_001c5c43:
    do {
      bVar3 = bVar12;
      bVar12 = bVar3 + 1;
    } while (1 << (bVar3 & 0x1f) < (int)uVar7);
    local_60->tile_rows_log2 = bVar3;
    local_60->tile_rows = (RK_U16)uVar7;
    bVar21 = true;
LAB_001c5c65:
    pAVar15 = local_60;
    if (!bVar21) {
      return local_64;
    }
  }
  else {
    RVar4 = mpp_av1_read_increment(local_58,RVar13,RVar20,"tile_cols_log2",(RK_U32 *)local_68);
    pAVar15 = local_60;
    RVar5 = RVar4;
    if (-1 < RVar4) {
      local_60->tile_cols_log2 = (RK_U8)local_68[0];
      RVar5 = local_64;
    }
    RVar13 = 0;
    if (-1 < RVar4) {
      bVar3 = local_60->tile_cols_log2;
      iVar18 = (int)local_48 + (1 << (bVar3 & 0x1f)) + -1 >> (bVar3 & 0x1f);
      local_60->tile_cols = (RK_U16)(((int)local_48 + iVar18 + -1) / iVar18);
      if (0 < (int)(RVar17 - bVar3)) {
        RVar13 = RVar17 - bVar3;
      }
      RVar4 = mpp_av1_read_increment(local_58,RVar13,range_max,"tile_rows_log2",(RK_U32 *)local_68);
      if (RVar4 < 0) {
        RVar5 = -1;
        RVar13 = 0;
      }
      else {
        pAVar15->tile_rows_log2 = (RK_U8)local_68[0];
        iVar14 = (int)local_50 + (1 << (pAVar15->tile_rows_log2 & 0x1f)) + -1 >>
                 (pAVar15->tile_rows_log2 & 0x1f);
        pAVar15->tile_rows = (RK_U16)(((int)local_50 + iVar14 + -1) / iVar14);
        if (pAVar15->tile_cols < 2) {
          uVar10 = (ulong)(pAVar15->tile_cols - 1);
          lVar6 = 0;
        }
        else {
          lVar6 = 0;
          do {
            pAVar15->width_in_sbs_minus_1[lVar6] = (char)iVar18 + 0xff;
            lVar6 = lVar6 + 1;
            uVar10 = (ulong)pAVar15->tile_cols - 1;
          } while (lVar6 < (long)uVar10);
        }
        pAVar15->width_in_sbs_minus_1[lVar6] = (char)local_48 + ~((char)uVar10 * (char)iVar18);
        if (pAVar15->tile_rows < 2) {
          uVar10 = (ulong)(pAVar15->tile_rows - 1);
          lVar6 = 0;
        }
        else {
          lVar6 = 0;
          do {
            pAVar15->height_in_sbs_minus_1[lVar6] = (char)iVar14 + 0xff;
            lVar6 = lVar6 + 1;
            uVar10 = (ulong)pAVar15->tile_rows - 1;
          } while (lVar6 < (long)uVar10);
        }
        pAVar15->height_in_sbs_minus_1[lVar6] = (char)local_50 + ~((char)uVar10 * (char)iVar14);
        RVar13 = 1;
      }
    }
    if ((char)RVar13 == '\0') {
      return RVar5;
    }
  }
  if ((pAVar15->tile_cols_log2 == 0) && (pAVar15->tile_rows_log2 == '\0')) {
    pAVar15->context_update_tile_id = 0;
    pAVar15->tile_size_bytes_minus1 = '\x03';
  }
  else {
    iVar18 = (uint)pAVar15->tile_rows_log2 + (uint)pAVar15->tile_cols_log2;
    RVar5 = mpp_av1_read_unsigned
                      (local_58,iVar18,"context_update_tile_id",(RK_U32 *)local_68,0,
                       ~(uint)(-1L << ((byte)iVar18 & 0x3f)));
    if (RVar5 < 0) {
      return -1;
    }
    pAVar15->context_update_tile_id = local_68[0];
    RVar5 = mpp_av1_read_unsigned(local_58,2,"tile_size_bytes_minus1",(RK_U32 *)local_68,0,3);
    if (RVar5 < 0) {
      return -1;
    }
    local_60->tile_size_bytes_minus1 = (RK_U8)local_68[0];
    pAVar15 = local_60;
  }
  local_38->tile_cols = (uint)pAVar15->tile_cols;
  local_38->tile_rows = (uint)pAVar15->tile_rows;
  return 0;
code_r0x001c5b86:
  local_60->height_in_sbs_minus_1[uVar10] = (RK_U8)local_68[0];
  iVar18 = iVar18 + (uint)local_60->height_in_sbs_minus_1[uVar10] + 1;
  uVar7 = uVar10 + 1;
  if (((int)local_50 <= iVar18) || (bVar21 = 0x3e < uVar10, uVar10 = uVar7, bVar21))
  goto LAB_001c5c43;
  goto LAB_001c5b66;
}

Assistant:

static RK_S32 mpp_av1_tile_info(AV1Context *ctx, BitReadCtx_t *gb,
                                AV1RawFrameHeader *current)
{
    const AV1RawSequenceHeader *seq = ctx->sequence_header;
    RK_S32 mi_cols, mi_rows, sb_cols, sb_rows, sb_shift, sb_size;
    RK_S32 max_tile_width_sb, max_tile_height_sb, max_tile_area_sb;
    RK_S32 min_log2_tile_cols, max_log2_tile_cols, max_log2_tile_rows;
    RK_S32 min_log2_tiles, min_log2_tile_rows;
    RK_S32 i, err;

    mi_cols = 2 * ((ctx->frame_width  + 7) >> 3);
    mi_rows = 2 * ((ctx->frame_height + 7) >> 3);

    sb_cols = seq->use_128x128_superblock ? ((mi_cols + 31) >> 5)
              : ((mi_cols + 15) >> 4);
    sb_rows = seq->use_128x128_superblock ? ((mi_rows + 31) >> 5)
              : ((mi_rows + 15) >> 4);

    sb_shift = seq->use_128x128_superblock ? 5 : 4;
    sb_size  = sb_shift + 2;

    max_tile_width_sb = AV1_MAX_TILE_WIDTH >> sb_size;
    max_tile_area_sb  = AV1_MAX_TILE_AREA  >> (2 * sb_size);

    min_log2_tile_cols = mpp_av1_tile_log2(max_tile_width_sb, sb_cols);
    max_log2_tile_cols = mpp_av1_tile_log2(1, MPP_MIN(sb_cols, AV1_MAX_TILE_COLS));
    max_log2_tile_rows = mpp_av1_tile_log2(1, MPP_MIN(sb_rows, AV1_MAX_TILE_ROWS));
    min_log2_tiles = MPP_MAX(min_log2_tile_cols,
                             mpp_av1_tile_log2(max_tile_area_sb, sb_rows * sb_cols));

    flag(uniform_tile_spacing_flag);

    if (current->uniform_tile_spacing_flag) {
        RK_S32 tile_width_sb, tile_height_sb;

        increment(tile_cols_log2, min_log2_tile_cols, max_log2_tile_cols);

        tile_width_sb = (sb_cols + (1 << current->tile_cols_log2) - 1) >>
                        current->tile_cols_log2;
        current->tile_cols = (sb_cols + tile_width_sb - 1) / tile_width_sb;

        min_log2_tile_rows = MPP_MAX(min_log2_tiles - current->tile_cols_log2, 0);

        increment(tile_rows_log2, min_log2_tile_rows, max_log2_tile_rows);

        tile_height_sb = (sb_rows + (1 << current->tile_rows_log2) - 1) >>
                         current->tile_rows_log2;
        current->tile_rows = (sb_rows + tile_height_sb - 1) / tile_height_sb;

        for (i = 0; i < current->tile_cols - 1; i++)
            infer(width_in_sbs_minus_1[i], tile_width_sb - 1);
        infer(width_in_sbs_minus_1[i],
              sb_cols - (current->tile_cols - 1) * tile_width_sb - 1);
        for (i = 0; i < current->tile_rows - 1; i++)
            infer(height_in_sbs_minus_1[i], tile_height_sb - 1);
        infer(height_in_sbs_minus_1[i],
              sb_rows - (current->tile_rows - 1) * tile_height_sb - 1);

    } else {
        RK_S32 widest_tile_sb, start_sb, size_sb, max_width, max_height;

        widest_tile_sb = 0;

        start_sb = 0;
        for (i = 0; start_sb < sb_cols && i < AV1_MAX_TILE_COLS; i++) {
            max_width = MPP_MIN(sb_cols - start_sb, max_tile_width_sb);
            ns(max_width, width_in_sbs_minus_1[i]);
            //ns(max_width, width_in_sbs_minus_1[i]);
            size_sb = current->width_in_sbs_minus_1[i] + 1;
            widest_tile_sb = MPP_MAX(size_sb, widest_tile_sb);
            start_sb += size_sb;
        }
        current->tile_cols_log2 = mpp_av1_tile_log2(1, i);
        current->tile_cols = i;

        if (min_log2_tiles > 0)
            max_tile_area_sb = (sb_rows * sb_cols) >> (min_log2_tiles + 1);
        else
            max_tile_area_sb = sb_rows * sb_cols;
        max_tile_height_sb = MPP_MAX(max_tile_area_sb / widest_tile_sb, 1);

        start_sb = 0;
        for (i = 0; start_sb < sb_rows && i < AV1_MAX_TILE_ROWS; i++) {
            max_height = MPP_MIN(sb_rows - start_sb, max_tile_height_sb);
            ns(max_height, height_in_sbs_minus_1[i]);
            size_sb = current->height_in_sbs_minus_1[i] + 1;
            start_sb += size_sb;
        }
        current->tile_rows_log2 = mpp_av1_tile_log2(1, i);
        current->tile_rows = i;
    }

    if (current->tile_cols_log2 > 0 ||
        current->tile_rows_log2 > 0) {
        fb(current->tile_cols_log2 + current->tile_rows_log2,
           context_update_tile_id);
        fb(2, tile_size_bytes_minus1);
    } else {
        infer(context_update_tile_id, 0);
        current->tile_size_bytes_minus1 = 3;
    }

    ctx->tile_cols = current->tile_cols;
    ctx->tile_rows = current->tile_rows;

    return 0;
}